

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::FunctionBody::GetLineCharOffset
          (FunctionBody *this,int byteCodeOffset,ULONG *_line,LONG *_charOffset,
          bool canAllocateLineCache)

{
  Type TVar1;
  SmallSpanSequence *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  StatementMap *pSVar6;
  Type startCharOfStatement;
  SmallSpanSequenceIter local_50;
  StatementData local_40;
  StatementData data;
  
  data = (StatementData)_charOffset;
  if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8 &
      4) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc76,"(!this->GetUtf8SourceInfo()->GetIsLibraryCode())",
                                "!this->GetUtf8SourceInfo()->GetIsLibraryCode()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  startCharOfStatement = (this->super_ParseableFunctionInfo).m_cchStartOffset;
  this_00 = (this->m_sourceInfo).pSpanSequence;
  if (this_00 == (SmallSpanSequence *)0x0) {
    pSVar6 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
    if (pSVar6 == (StatementMap *)0x0) goto LAB_006cc74b;
    TVar1 = (pSVar6->sourceSpan).begin;
  }
  else {
    local_50.accumulatedIndex = 0;
    local_50.accumulatedSourceBegin = this_00->baseValue;
    local_50.accumulatedBytecodeBegin = 0;
    local_50.indexOfActualOffset = 0;
    local_40.sourceBegin = 0;
    local_40.bytecodeBegin = 0;
    BVar4 = SmallSpanSequence::GetMatchingStatementFromBytecode
                      (this_00,byteCodeOffset,&local_50,&local_40);
    if (BVar4 == 0) goto LAB_006cc74b;
    TVar1 = local_40.sourceBegin;
  }
  if ((ulong)(long)(int)TVar1 <
      (ulong)((this->super_ParseableFunctionInfo).m_cbLength +
             (this->super_ParseableFunctionInfo).m_cbStartOffset)) {
    startCharOfStatement = TVar1;
  }
LAB_006cc74b:
  bVar3 = GetLineCharOffsetFromStartChar
                    (this,startCharOfStatement,_line,(LONG *)data,canAllocateLineCache);
  return bVar3;
}

Assistant:

bool FunctionBody::GetLineCharOffset(int byteCodeOffset, ULONG* _line, LONG* _charOffset, bool canAllocateLineCache /*= true*/)
    {
        Assert(!this->GetUtf8SourceInfo()->GetIsLibraryCode());

        int startCharOfStatement = this->m_cchStartOffset; // Default to the start of this function

        if (m_sourceInfo.pSpanSequence)
        {
            SmallSpanSequenceIter iter;
            m_sourceInfo.pSpanSequence->Reset(iter);

            StatementData data;

            if (m_sourceInfo.pSpanSequence->GetMatchingStatementFromBytecode(byteCodeOffset, iter, data)
                && EndsAfter(data.sourceBegin))
            {
                startCharOfStatement = data.sourceBegin;
            }
        }
        else
        {
            Js::FunctionBody::StatementMap* map = this->GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
            if (map && EndsAfter(map->sourceSpan.begin))
            {
                startCharOfStatement = map->sourceSpan.begin;
            }
        }

        return this->GetLineCharOffsetFromStartChar(startCharOfStatement, _line, _charOffset, canAllocateLineCache);
    }